

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrq.cc
# Opt level: O2

base_learner * lrq_setup(options_i *options,vw *all)

{
  char *pcVar1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  option_group_definition *this;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  base_learner *l;
  single_learner *base;
  learner<LRQstate,_example> *plVar8;
  vw_exception *this_00;
  long lVar9;
  uint uVar10;
  size_t i;
  ulong uVar11;
  allocator local_4d4;
  allocator local_4d3;
  allocator local_4d2;
  allocator local_4d1;
  free_ptr<LRQstate> lrq;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lrq_names;
  string local_490 [32];
  string local_470;
  string local_450 [32];
  string local_430;
  string local_410;
  string local_3f0;
  option_group_definition new_options;
  undefined1 local_398 [112];
  bool local_328;
  stringstream __msg;
  undefined1 local_2e8 [96];
  bool local_288;
  typed_option<bool> local_170;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  
  scoped_calloc_or_throw<LRQstate>();
  lrq_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lrq_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lrq_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_410,"Low Rank Quadratics",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::string((string *)&local_430,"lrq",&local_4d1);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__msg,&local_430,&lrq_names);
  local_288 = true;
  std::__cxx11::string::string(local_450,"use low rank quadratic features",&local_4d2);
  std::__cxx11::string::_M_assign((string *)(local_2e8 + 0x20));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_d0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__msg);
  this = VW::config::option_group_definition::
         add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                   (&new_options,&local_d0);
  std::__cxx11::string::string((string *)&local_470,"lrqdropout",&local_4d3);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_398,&local_470,
             &(lrq._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_LRQstate_*,_false>._M_head_impl)->dropout);
  local_328 = true;
  std::__cxx11::string::string
            (local_490,"use dropout training for low rank quadratic features",&local_4d4);
  std::__cxx11::string::_M_assign((string *)(local_398 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_398);
  VW::config::option_group_definition::add<bool>(this,&local_170);
  VW::config::typed_option<bool>::~typed_option(&local_170);
  std::__cxx11::string::~string(local_490);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_398);
  std::__cxx11::string::~string((string *)&local_470);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option(&local_d0);
  std::__cxx11::string::~string(local_450);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&__msg);
  std::__cxx11::string::~string((string *)&local_430);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&__msg,"lrq",(allocator *)local_398);
  iVar4 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar4 == '\0') {
    plVar8 = (learner<LRQstate,_example> *)0x0;
  }
  else {
    (lrq._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.super__Head_base<0UL,_LRQstate_*,_false>.
    _M_head_impl)->all = all;
    lVar9 = 0;
    uVar11 = 0;
    while( true ) {
      if ((ulong)((long)lrq_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)lrq_names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar11) break;
      spoof_hex_encoded_namespaces
                ((string *)&__msg,
                 (string *)
                 ((long)&((lrq_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9));
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&((lrq_names.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9),
                 (string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      uVar11 = uVar11 + 1;
      lVar9 = lVar9 + 0x20;
    }
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    set<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(lrq._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_LRQstate_*,_false>._M_head_impl)->lrpairs,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )lrq_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )lrq_names.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    uVar11 = all->random_seed | 0x845fed;
    (lrq._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.super__Head_base<0UL,_LRQstate_*,_false>.
    _M_head_impl)->seed = uVar11;
    (lrq._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.super__Head_base<0UL,_LRQstate_*,_false>.
    _M_head_impl)->initial_seed = uVar11;
    if (all->quiet == false) {
      std::operator<<(&(all->trace_message).super_ostream,
                      "creating low rank quadratic features for pairs: ");
      if ((lrq._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.
           super__Head_base<0UL,_LRQstate_*,_false>._M_head_impl)->dropout == true) {
        std::operator<<(&(all->trace_message).super_ostream,"(using dropout) ");
      }
    }
    psVar2 = &(lrq._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_LRQstate_*,_false>._M_head_impl)->lrpairs;
    uVar10 = 0;
    for (p_Var7 = ((lrq._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
                    super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.
                    super__Head_base<0UL,_LRQstate_*,_false>._M_head_impl)->lrpairs)._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      if (all->quiet == false) {
        if (p_Var7[1]._M_parent < (_Base_ptr)0x3) {
LAB_0020633c:
          std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
          std::operator<<((ostream *)local_2e8,
                          "error, low-rank quadratic features must involve two sets and a rank.");
          this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this_00,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lrq.cc"
                     ,0xc3,&local_3f0);
          __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        bVar3 = valid_int((char *)(*(long *)(p_Var7 + 1) + 2));
        if (!bVar3) goto LAB_0020633c;
        poVar6 = std::operator<<(&(all->trace_message).super_ostream,(string *)(p_Var7 + 1));
        std::operator<<(poVar6," ");
      }
      pcVar1 = *(char **)(p_Var7 + 1);
      uVar5 = atoi(pcVar1 + 2);
      (lrq._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.super__Head_base<0UL,_LRQstate_*,_false>
      ._M_head_impl)->lrindices[*pcVar1] = true;
      (lrq._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.super__Head_base<0UL,_LRQstate_*,_false>
      ._M_head_impl)->lrindices[*(char *)(*(long *)(p_Var7 + 1) + 1)] = true;
      if (uVar10 <= uVar5) {
        uVar10 = uVar5;
      }
    }
    if (all->quiet == false) {
      std::endl<char,std::char_traits<char>>(&(all->trace_message).super_ostream);
    }
    all->wpp = all->wpp * (uVar10 + 1);
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar8 = LEARNER::init_learner<LRQstate,example,LEARNER::learner<char,example>>
                       (&lrq,base,predict_or_learn<true>,predict_or_learn<false>,(ulong)(uVar10 + 1)
                       );
    *(undefined8 *)(plVar8 + 0x88) = *(undefined8 *)(plVar8 + 0x18);
    *(undefined8 *)(plVar8 + 0x90) = *(undefined8 *)(plVar8 + 0x20);
    *(code **)(plVar8 + 0x98) = reset_seed;
    *(undefined8 *)(plVar8 + 0xb8) = *(undefined8 *)(plVar8 + 0x18);
    *(undefined8 *)(plVar8 + 0xc0) = *(undefined8 *)(plVar8 + 0x20);
    *(code **)(plVar8 + 200) = finish;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&lrq_names);
  std::unique_ptr<LRQstate,_void_(*)(void_*)>::~unique_ptr(&lrq);
  return (base_learner *)plVar8;
}

Assistant:

base_learner* lrq_setup(options_i& options, vw& all)
{
  auto lrq = scoped_calloc_or_throw<LRQstate>();
  vector<string> lrq_names;
  option_group_definition new_options("Low Rank Quadratics");
  new_options.add(make_option("lrq", lrq_names).keep().help("use low rank quadratic features"))
      .add(make_option("lrqdropout", lrq->dropout).keep().help("use dropout training for low rank quadratic features"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("lrq"))
    return nullptr;

  uint32_t maxk = 0;
  lrq->all = &all;

  for (size_t i = 0; i < lrq_names.size(); i++) lrq_names[i] = spoof_hex_encoded_namespaces(lrq_names[i]);

  new (&lrq->lrpairs) std::set<std::string>(lrq_names.begin(), lrq_names.end());

  lrq->initial_seed = lrq->seed = all.random_seed | 8675309;

  if (!all.quiet)
  {
    all.trace_message << "creating low rank quadratic features for pairs: ";
    if (lrq->dropout)
      all.trace_message << "(using dropout) ";
  }

  for (string const& i : lrq->lrpairs)
  {
    if (!all.quiet)
    {
      if ((i.length() < 3) || !valid_int(i.c_str() + 2))
        THROW("error, low-rank quadratic features must involve two sets and a rank.");

      all.trace_message << i << " ";
    }
    // TODO: colon-syntax

    unsigned int k = atoi(i.c_str() + 2);

    lrq->lrindices[(int)i[0]] = 1;
    lrq->lrindices[(int)i[1]] = 1;

    maxk = max(maxk, k);
  }

  if (!all.quiet)
    all.trace_message << endl;

  all.wpp = all.wpp * (uint64_t)(1 + maxk);
  learner<LRQstate, example>& l = init_learner(
      lrq, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, 1 + maxk);
  l.set_end_pass(reset_seed);
  l.set_finish(finish);

  // TODO: leaks memory ?
  return make_base(l);
}